

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall mp::BinaryReadError::~BinaryReadError(BinaryReadError *this)

{
  ~BinaryReadError(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~BinaryReadError() throw() {}